

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::PrepareProgram
          (BufferTest *this,GLchar *variable_declaration)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLsizei GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  undefined4 *puVar10;
  ulong uVar11;
  Enum<int,_2UL> EVar12;
  char *local_4a0;
  char *local_490;
  uint local_3ec;
  undefined1 local_3e8 [4];
  GLuint i_2;
  char *local_268;
  GLchar *log_text_1;
  uint local_258;
  GLint log_size_1;
  GLuint i_1;
  GLint status;
  GLchar *local_248;
  GetNameFunc local_240;
  int local_238;
  Enum<int,_2UL> local_230;
  MessageBuilder local_220;
  char *local_a0;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  undefined4 local_7c;
  undefined *puStack_78;
  GLuint shader_count;
  Shader shader [2];
  Functions *gl;
  GLchar *variable_declaration_local;
  BufferTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  puStack_78 = s_vertex_shader;
  shader[0].source[0] = (GLchar *)0x0;
  shader[0].source[1] = (GLchar *)0x0;
  shader[0].source[2]._0_4_ = 1;
  shader[0].source[2]._4_4_ = 0x8b31;
  shader[0].count = 0;
  shader[0]._32_8_ = s_fragment_shader_head;
  shader[1].source[1] = s_fragment_shader_tail;
  shader[1].source[2]._0_4_ = 3;
  shader[1].source[2]._4_4_ = 0x8b30;
  shader[1].count = 0;
  local_7c = 2;
  shader[1].source[0] = variable_declaration;
  GVar2 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po = GVar2;
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x3d3);
  for (log_size = 0; (uint)log_size < 2; log_size = log_size + 1) {
    GVar4 = (**(code **)(lVar6 + 0x3f0))
                      (*(undefined4 *)((long)shader[(uint)log_size].source + 0x14));
    shader[(uint)log_size].count = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3dc);
    (**(code **)(lVar6 + 0x10))(this->m_po,shader[(uint)log_size].count);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3e0);
    uVar11 = (ulong)(uint)log_size;
    (**(code **)(lVar6 + 0x12b8))
              (shader[uVar11].count,*(undefined4 *)(shader[uVar11].source + 2),
               &shader[uVar11 - 1].id,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3e4);
    (**(code **)(lVar6 + 0x248))(shader[(uint)log_size].count);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,1000);
    log_text._4_4_ = 0;
    (**(code **)(lVar6 + 0xa70))(shader[(uint)log_size].count,0x8b81,(long)&log_text + 4);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3ed);
    if (log_text._4_4_ == 0) {
      log_text._0_4_ = 0;
      (**(code **)(lVar6 + 0xa70))(shader[(uint)log_size].count,0x8b84,&log_text);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x3f3);
      local_a0 = (char *)operator_new__((long)(int)log_text);
      (**(code **)(lVar6 + 0xa58))(shader[(uint)log_size].count,(int)log_text,0,local_a0);
      pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar8 = tcu::TestContext::getLog(pTVar7);
      tcu::TestLog::operator<<(&local_220,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_220,(char (*) [32])"Shader compilation has failed.\n");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])"Shader type: ");
      EVar12 = glu::getShaderTypeStr(*(int *)((long)shader[(uint)log_size].source + 0x14));
      local_240 = EVar12.m_getName;
      local_238 = EVar12.m_value;
      local_230.m_getName = local_240;
      local_230.m_value = local_238;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_230);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [31])"Shader compilation error log:\n");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_a0);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [21])"Shader source code:\n");
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char **)&shader[(ulong)(uint)log_size - 1].id);
      if (shader[(uint)log_size].source[0] == (GLchar *)0x0) {
        local_490 = "";
      }
      else {
        local_490 = shader[(uint)log_size].source[0];
      }
      local_248 = local_490;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_248);
      if (shader[(uint)log_size].source[1] == (GLchar *)0x0) {
        local_4a0 = "";
      }
      else {
        local_4a0 = shader[(uint)log_size].source[1];
      }
      _i_1 = local_4a0;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)&i_1);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_220);
      if (local_a0 != (char *)0x0) {
        operator_delete__(local_a0);
      }
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x405);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
  }
  (**(code **)(lVar6 + 0xce8))(this->m_po);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x40f);
  log_size_1 = 0;
  (**(code **)(lVar6 + 0x9d8))(this->m_po,0x8b82,&log_size_1);
  if (log_size_1 != 1) {
    log_text_1._4_4_ = 0;
    (**(code **)(lVar6 + 0x9d8))(this->m_po,0x8b84,(long)&log_text_1 + 4);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x427);
    local_268 = (char *)operator_new__((long)log_text_1._4_4_);
    (**(code **)(lVar6 + 0x988))(this->m_po,log_text_1._4_4_,0,local_268);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_3e8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_3e8,
                        (char (*) [36])"Program linkage has failed due to:\n");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_268);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3e8);
    if (local_268 != (char *)0x0) {
      operator_delete__(local_268);
    }
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x433);
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  for (local_258 = 0; local_258 < 2; local_258 = local_258 + 1) {
    if (shader[local_258].count != 0) {
      (**(code **)(lVar6 + 0x4e0))(this->m_po,shader[local_258].count);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glDetachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x41d);
    }
  }
  for (local_3ec = 0; local_3ec < 2; local_3ec = local_3ec + 1) {
    if (shader[local_3ec].count != 0) {
      (**(code **)(lVar6 + 0x470))(shader[local_3ec].count);
      shader[local_3ec].count = 0;
    }
  }
  if (this->m_po == 0) {
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  return;
}

Assistant:

void BufferTest::PrepareProgram(const glw::GLchar* variable_declaration)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLsizei const count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = {
		{ { s_vertex_shader, NULL, NULL }, 1, GL_VERTEX_SHADER, 0 },
		{ { s_fragment_shader_head, variable_declaration, s_fragment_shader_tail }, 3, GL_FRAGMENT_SHADER, 0 }
	};

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source[0] << (shader[i].source[1] ? shader[i].source[1] : "")
						<< (shader[i].source[2] ? shader[i].source[2] : "") << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}